

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_flatteningCheckImportModelsForChanges_Test::TestBody
          (ModelFlattening_flatteningCheckImportModelsForChanges_Test *this)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  AssertionResult gtest_ar_2;
  AssertHelper local_c0 [8];
  ModelPtr flatModel;
  ModelPtr model;
  PrinterPtr printer;
  ModelPtr importedModel;
  ImporterPtr importer;
  ParserPtr parser;
  string eChild;
  string eParent;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&eParent,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"InitializedVariables_model\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"child.cellml\">\n    <component component_ref=\"not_main\" name=\"child_main\"/>\n  </import>\n  <component name=\"main\">\n    <variable name=\"kComminuteOralMin\" units=\"dimensionless\" interface=\"public\"/>\n  </component>\n  <connection component_1=\"child_main\" component_2=\"main\">\n    <map_variables variable_1=\"kComminuteOralMin\" variable_2=\"kComminuteOralMin\"/>\n  </connection>\n</model>\n"
             ,(allocator<char> *)&eChild);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&eChild,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"AnimalConstants_model\">\n  <units name=\"perS\">\n    <unit exponent=\"-1\" units=\"second\"/>\n  </units>\n  <component name=\"not_main\">\n    <variable name=\"kComminuteOralMax\" units=\"dimensionless\" initial_value=\"0.934\" interface=\"public\"/>\n    <variable name=\"TAveabsE\" units=\"perS\" initial_value=\"0.05\" interface=\"public\"/>\n  </component>\n</model>\n"
             ,(allocator<char> *)&local_f0);
  libcellml::Importer::create(SUB81(&importer,0));
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Printer::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&importedModel,"modelflattening/user_ex_01/parent.cellml",
             (allocator<char> *)&flatModel);
  fileContents((string *)&local_f0);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&importedModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&importedModel,"modelflattening/user_ex_01",(allocator<char> *)&flatModel);
  resourcePath((string *)&local_f0);
  libcellml::Importer::resolveImports
            ((shared_ptr *)
             importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&model);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&importedModel);
  local_f0._M_dataplus._M_p = (pointer)0x0;
  libcellml::Importer::library((ulong *)&importedModel);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&local_f0,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&flatModel,"eChild","printer->printModel(importedModel)",&eChild,&local_f0)
  ;
  std::__cxx11::string::~string((string *)&local_f0);
  if ((char)flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&local_f0);
    if (flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x729,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&local_f0,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&flatModel,"eParent","printer->printModel(model)",&eParent,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  if ((char)flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&local_f0);
    if (flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x72a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&flatModel);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&local_f0,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"eChild","printer->printModel(importedModel)",&eChild,&local_f0
            );
  std::__cxx11::string::~string((string *)&local_f0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x72e,pcVar1);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&local_f0,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"eParent","printer->printModel(model)",&eParent,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x72f,pcVar1);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&eChild);
  std::__cxx11::string::~string((string *)&eParent);
  return;
}

Assistant:

TEST(ModelFlattening, flatteningCheckImportModelsForChanges)
{
    const std::string eParent =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"InitializedVariables_model\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"child.cellml\">\n"
        "    <component component_ref=\"not_main\" name=\"child_main\"/>\n"
        "  </import>\n"
        "  <component name=\"main\">\n"
        "    <variable name=\"kComminuteOralMin\" units=\"dimensionless\" interface=\"public\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"child_main\" component_2=\"main\">\n"
        "    <map_variables variable_1=\"kComminuteOralMin\" variable_2=\"kComminuteOralMin\"/>\n"
        "  </connection>\n"
        "</model>\n";
    const std::string eChild =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"AnimalConstants_model\">\n"
        "  <units name=\"perS\">\n"
        "    <unit exponent=\"-1\" units=\"second\"/>\n"
        "  </units>\n"
        "  <component name=\"not_main\">\n"
        "    <variable name=\"kComminuteOralMax\" units=\"dimensionless\" initial_value=\"0.934\" interface=\"public\"/>\n"
        "    <variable name=\"TAveabsE\" units=\"perS\" initial_value=\"0.05\" interface=\"public\"/>\n"
        "  </component>\n"
        "</model>\n";

    auto importer = libcellml::Importer::create(false);
    auto parser = libcellml::Parser::create(false);
    auto printer = libcellml::Printer::create();

    auto model = parser->parseModel(fileContents("modelflattening/user_ex_01/parent.cellml"));
    importer->resolveImports(model, resourcePath("modelflattening/user_ex_01"));

    auto importedModel = importer->library(0);

    EXPECT_EQ(eChild, printer->printModel(importedModel));
    EXPECT_EQ(eParent, printer->printModel(model));

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(eChild, printer->printModel(importedModel));
    EXPECT_EQ(eParent, printer->printModel(model));
}